

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_cbs_auth.c
# Opt level: O2

int authentication_stop(AUTHENTICATION_HANDLE authentication_handle)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  if (authentication_handle == (AUTHENTICATION_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x197;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x197;
    }
    pcVar4 = "authentication_stop failed (authentication_handle is NULL)";
    iVar2 = 0x198;
  }
  else {
    if (authentication_handle->state != AUTHENTICATION_STATE_STOPPED) {
      authentication_handle->cbs_handle = (CBS_HANDLE)0x0;
      update_state(authentication_handle,AUTHENTICATION_STATE_STOPPED);
      return 0;
    }
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x1a0;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x1a0;
    }
    pcVar4 = "authentication_stop failed (messenger is already stopped)";
    iVar2 = 0x1a1;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
            ,"authentication_stop",iVar2,1,pcVar4);
  return iVar3;
}

Assistant:

int authentication_stop(AUTHENTICATION_HANDLE authentication_handle)
{
    int result;

    if (authentication_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("authentication_stop failed (authentication_handle is NULL)");
    }
    else
    {
        AUTHENTICATION_INSTANCE* instance = (AUTHENTICATION_INSTANCE*)authentication_handle;

        if (instance->state == AUTHENTICATION_STATE_STOPPED)
        {
            result = MU_FAILURE;
            LogError("authentication_stop failed (messenger is already stopped)");
        }
        else
        {
            instance->cbs_handle = NULL;

            update_state(instance, AUTHENTICATION_STATE_STOPPED);

            result = RESULT_OK;
        }
    }

    return result;
}